

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::CopyPropagateArrays::GetMemberTypeId
          (CopyPropagateArrays *this,uint32_t id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *access_chain)

{
  uint uVar1;
  Op OVar2;
  pointer puVar3;
  IRContext *this_00;
  Instruction *this_01;
  uint32_t index;
  pointer puVar5;
  uint uVar4;
  
  puVar5 = (access_chain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (access_chain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (puVar5 == puVar3) {
      return id;
    }
    uVar1 = *puVar5;
    this_00 = (this->super_MemPass).super_Pass.context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = analysis::DefUseManager::GetDef
                        ((this_00->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,id);
    OVar2 = this_01->opcode_;
    if (OVar2 < OpTypeOpaque) {
      if ((0x31800000U >> (OVar2 & OpTypeOpaque) & 1) == 0) {
        if (OVar2 != OpTypeStruct) goto LAB_0059002e;
        uVar4 = (this_01->has_result_id_ & 1) + 1;
        if (this_01->has_type_id_ == false) {
          uVar4 = (uint)this_01->has_result_id_;
        }
        index = uVar4 + uVar1;
      }
      else {
        index = (this_01->has_result_id_ & 1) + 1;
        if (this_01->has_type_id_ == false) {
          index = (uint)this_01->has_result_id_;
        }
      }
      id = Instruction::GetSingleWordOperand(this_01,index);
    }
LAB_0059002e:
    if (id == 0) {
      __assert_fail("id != 0 && \"Tried to extract from an object where it cannot be done.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                    ,0x353,
                    "uint32_t spvtools::opt::CopyPropagateArrays::GetMemberTypeId(uint32_t, const std::vector<uint32_t> &) const"
                   );
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

uint32_t CopyPropagateArrays::GetMemberTypeId(
    uint32_t id, const std::vector<uint32_t>& access_chain) const {
  for (uint32_t element_index : access_chain) {
    Instruction* type_inst = get_def_use_mgr()->GetDef(id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeVector:
        id = type_inst->GetSingleWordInOperand(0);
        break;
      case spv::Op::OpTypeStruct:
        id = type_inst->GetSingleWordInOperand(element_index);
        break;
      default:
        break;
    }
    assert(id != 0 &&
           "Tried to extract from an object where it cannot be done.");
  }
  return id;
}